

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::
     log<char_const(&)[77],kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>,kj::None_const&>&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [77],
               DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
               *params_1)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  long lVar3;
  String argValues [2];
  ArrayPtr<kj::String> in_stack_ffffffffffffff78;
  char *apcStack_78 [2];
  size_t sStack_68;
  ArrayDisposer *pAStack_60;
  String local_50;
  StringPtr local_38;
  char *local_28;
  undefined8 local_20;
  
  str<char_const(&)[77]>
            ((String *)&stack0xffffffffffffff78,(kj *)CONCAT44(in_register_00000014,severity),
             (char (*) [77])CONCAT44(in_register_00000014,severity));
  local_28 = "(can\'t stringify)";
  local_20 = 0x12;
  local_38.content.ptr = "(can\'t stringify)";
  local_38.content.size_ = 0x12;
  concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
            (&local_50,(_ *)&local_28,(StringPtr *)(macroArgs + 0x10),&local_38,(StringPtr *)params)
  ;
  apcStack_78[1] = local_50.content.ptr;
  sStack_68 = local_50.content.size_;
  pAStack_60 = local_50.content.disposer;
  logInternal((Debug *)
              "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
              ,(char *)((ulong)file & 0xffffffff),2,line,&stack0xffffffffffffff78,
              in_stack_ffffffffffffff78);
  lVar3 = 0x18;
  do {
    lVar1 = *(long *)(&stack0xffffffffffffff78 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(&stack0xffffffffffffff80 + lVar3);
      *(undefined8 *)(&stack0xffffffffffffff78 + lVar3) = 0;
      *(undefined8 *)(&stack0xffffffffffffff80 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)apcStack_78 + lVar3))
                (*(undefined8 **)((long)apcStack_78 + lVar3),lVar1,1,uVar2,uVar2,0);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}